

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_ClassArray<ON_HatchLine>::Append(ON_ClassArray<ON_HatchLine> *this,int count,ON_HatchLine *p)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  if (p != (ON_HatchLine *)0x0 && 0 < count) {
    uVar3 = (ulong)(uint)count;
    if (this->m_capacity < this->m_count + count) {
      iVar1 = NewCapacity(this);
      iVar2 = this->m_count + count;
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      Reserve(this,(long)iVar2);
    }
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      iVar2 = this->m_count;
      this->m_count = iVar2 + 1;
      ON_HatchLine::operator=(this->m_a + iVar2,p);
      p = p + 1;
    }
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}